

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::addSingleton(ISingleton *singleton)

{
  value_type *in_stack_00000008;
  vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_> *in_stack_00000010;
  
  anon_unknown_1::getSingletons();
  clara::std::vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>::push_back
            (in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

void addSingleton(ISingleton* singleton ) {
        getSingletons()->push_back( singleton );
    }